

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

sz_sock __thiscall sznet::net::Connector::removeAndResetChannel(Connector *this)

{
  sz_sock sVar1;
  Channel *this_00;
  EventLoop *this_01;
  char *in_RSI;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  this_00 = (this->m_channel)._M_t.
            super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
            _M_t.
            super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
            .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  this_00->m_events = 0;
  Channel::update(this_00);
  Channel::remove((this->m_channel)._M_t.
                  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                  .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,in_RSI);
  this_01 = this->m_loop;
  sVar1 = ((this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_fd;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  pcStack_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = resetChannel;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(Connector **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
               ::_M_manager;
  EventLoop::queueInLoop(this_01,(Functor *)&local_48);
  if (pcStack_38 != (code *)0x0) {
    (*pcStack_38)(&local_48,&local_48,__destroy_functor);
  }
  return sVar1;
}

Assistant:

sockets::sz_sock Connector::removeAndResetChannel()
{
	m_channel->disableAll();
	m_channel->remove();
	sockets::sz_sock sockfd = m_channel->fd();
	// Can't reset m_channel here, because we are inside Channel::handleEvent
	// FIXME: unsafe
	m_loop->queueInLoop(std::bind(&Connector::resetChannel, this));
	return sockfd;
}